

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseFrameSet(TidyDocImpl *doc,Node *frameset,GetTokenMode mode)

{
  int iVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  Node *pNVar4;
  TidyParserMemory data;
  Bool BVar5;
  Node *node;
  Node **ppNVar6;
  
  if (frameset == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    if ((long)iVar1 < 0) {
      frameset = (Node *)0x0;
    }
    else {
      frameset = (doc->stack).content[iVar1].original_node;
      (doc->stack).top = iVar1 + -1;
    }
  }
  else if ((doc->config).value[1].v == 0) {
    *(byte *)&doc->badAccess = (byte)doc->badAccess | 0x10;
  }
  pLVar2 = doc->lexer;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  if (node != (Node *)0x0) {
    do {
      if ((node->tag == frameset->tag) && (node->type == EndTag)) {
        prvTidyFreeNode(doc,node);
        frameset->closed = yes;
        TrimSpaces(doc,frameset);
        return (Node *)0x0;
      }
      BVar5 = InsertMisc(frameset,node);
      if (BVar5 == no) {
        if (node->tag != (Dict *)0x0) {
          BVar5 = prvTidynodeIsElement(node);
          pDVar3 = node->tag;
          if (BVar5 == no) {
            if (pDVar3 != (Dict *)0x0) goto LAB_0013a24d;
          }
          else if (pDVar3 != (Dict *)0x0) {
            if ((pDVar3->model & 4) != 0) {
              MoveToHead(doc,frameset,node);
              goto LAB_0013a2fc;
            }
LAB_0013a24d:
            if (pDVar3->id == TidyTag_BODY) {
              prvTidyUngetToken(doc);
              node = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
              prvTidyReport(doc,frameset,node,0x247);
            }
          }
          pDVar3 = node->tag;
          if (node->type == StartEndTag) {
            if (pDVar3 != (Dict *)0x0) {
              if ((pDVar3->model & 0x2000) == 0) goto LAB_0013a2d0;
              node->parent = frameset;
              pNVar4 = frameset->last;
              node->prev = pNVar4;
              ppNVar6 = &pNVar4->next;
              if (pNVar4 == (Node *)0x0) {
                ppNVar6 = &frameset->content;
              }
              *ppNVar6 = node;
              frameset->last = node;
              goto LAB_0013a2fc;
            }
          }
          else if (node->type == StartTag) {
            if (pDVar3 != (Dict *)0x0) {
              if ((pDVar3->model & 0x2000) != 0) {
                node->parent = frameset;
                pNVar4 = frameset->last;
                ppNVar6 = &pNVar4->next;
                if (pNVar4 == (Node *)0x0) {
                  ppNVar6 = &frameset->content;
                }
                node->prev = pNVar4;
                *ppNVar6 = node;
                frameset->last = node;
                pLVar2->excludeBlocks = no;
                data.original_node = frameset;
                data.identity = prvTidyParseFrameSet;
                data.reentry_node = node;
                data.reentry_mode = IgnoreWhitespace;
                data.reentry_state = 0;
                data.mode = MixedContent;
                data.register_1 = 0;
                data._40_8_ = 0;
                prvTidypushMemory(doc,data);
                return node;
              }
LAB_0013a2d0:
              if (pDVar3->id == TidyTag_A) {
                *(byte *)&doc->badAccess = (byte)doc->badAccess | 0x40;
              }
            }
          }
          else if (pDVar3 != (Dict *)0x0) goto LAB_0013a2d0;
        }
        prvTidyReport(doc,frameset,node,0x235);
        prvTidyFreeNode(doc,node);
      }
LAB_0013a2fc:
      node = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (node != (Node *)0x0);
  }
  prvTidyReport(doc,frameset,(Node *)0x0,0x25a);
  return (Node *)0x0;
}

Assistant:

Node* TY_(ParseFrameSet)( TidyDocImpl* doc, Node *frameset, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    DEBUG_LOG_COUNTERS;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( frameset == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, because we replace it entering the loop. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        frameset = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(frameset);
        if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
        {
            doc->badAccess |= BA_USING_FRAMES;
        }
    }

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == frameset->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            frameset->closed = yes;
            TrimSpaces(doc, frameset);
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(frameset, node))
            continue;

        if (node->tag == NULL)
        {
            TY_(Report)(doc, frameset, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if (TY_(nodeIsElement)(node))
        {
            if (node->tag && node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, frameset, node);
                continue;
            }
        }

        if ( nodeIsBODY(node) )
        {
            TY_(UngetToken)( doc );
            node = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
            TY_(Report)(doc, frameset, node, INSERTING_TAG);
        }

        if (node->type == StartTag && (node->tag && node->tag->model & CM_FRAMES))
        {
            TY_(InsertNodeAtEnd)(frameset, node);
            lexer->excludeBlocks = no;
            
            /*
             * We don't really have to do anything when re-entering, except
             * setting up the state when we left. No post-processing means
             * this stays simple.
             */
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseFrameSet);
            memory.original_node = frameset;
            memory.reentry_node = node;
            memory.mode = MixedContent;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }
        else if (node->type == StartEndTag && (node->tag && node->tag->model & CM_FRAMES))
        {
            TY_(InsertNodeAtEnd)(frameset, node);
            continue;
        }

        /* discard unexpected tags */
        /* WAI [6.5.1.4] link is being discarded outside of NOFRAME */
        if ( nodeIsA(node) )
           doc->badAccess |= BA_INVALID_LINK_NOFRAMES;

        TY_(Report)(doc, frameset, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, frameset, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}